

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadHeap.cpp
# Opt level: O2

void __thiscall QuadHeap::QuadHeap(QuadHeap *this)

{
  int x;
  long lVar1;
  long lVar2;
  bool (*pabVar3) [20];
  _Vector_base<Quad_*,_std::allocator<Quad_*>_> local_38;
  
  *(undefined ***)&this->super_Entity = &PTR__Coordinated_00130708;
  Entity::Entity(&this->super_Entity,&PTR_PTR_00130470,Vec2d::ORIGIN,Vec2d::ORIGIN);
  *(undefined ***)&this->super_Entity = &PTR__QuadHeap_00130350;
  this->super_Drawable = (Drawable)&PTR__QuadHeap_00130400;
  (this->super_Collidable)._vptr_Collidable = (_func_int **)&PTR_collidesWithQuads_00130458;
  (this->quads).super__Vector_base<Quad_*,_std::allocator<Quad_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->quads).super__Vector_base<Quad_*,_std::allocator<Quad_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->quads).super__Vector_base<Quad_*,_std::allocator<Quad_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Quad_*,_std::allocator<Quad_*>_>::_M_move_assign(&this->quads,&local_38);
  std::_Vector_base<Quad_*,_std::allocator<Quad_*>_>::~_Vector_base(&local_38);
  pabVar3 = this->quadState;
  for (lVar1 = 0; lVar2 = -0x14, lVar1 != 10; lVar1 = lVar1 + 1) {
    for (; lVar2 != 0; lVar2 = lVar2 + 1) {
      pabVar3[1][lVar2] = false;
    }
    pabVar3 = pabVar3 + 1;
  }
  return;
}

Assistant:

QuadHeap::QuadHeap(): Entity(Vec2d::ORIGIN, Vec2d::ORIGIN) {
    quads = vector<Quad*>();
    
    for (int x=0; x<10; x++) {
        for (int y=0; y<20; y++) {
            quadState[x][y] = false;
        }
    }
}